

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O3

void __thiscall MainWindow::openFile(MainWindow *this,QString *path)

{
  ModuleFile *this_00;
  int iVar1;
  FormatError FVar2;
  QMessageBox msgbox;
  QArrayData *local_60 [3];
  QString local_48;
  
  Renderer::forceStop(this->mRenderer);
  QCursor::QCursor((QCursor *)&local_48,WaitCursor);
  QGuiApplication::setOverrideCursor((QCursor *)&local_48);
  QCursor::~QCursor((QCursor *)&local_48);
  this_00 = &this->mModuleFile;
  iVar1 = ModuleFile::open(this_00,(char *)path,(int)this->mModule);
  QGuiApplication::restoreOverrideCursor();
  if ((char)iVar1 == '\0') {
    QMessageBox::QMessageBox((QMessageBox *)&local_48,(QWidget *)0x0);
    QMessageBox::setIcon((Icon)(QMessageBox *)&local_48);
    QMetaObject::tr((char *)local_60,(char *)&staticMetaObject,0x1b4e1c);
    QMessageBox::setText(&local_48);
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,8);
      }
    }
    FVar2 = ModuleFile::lastError(this_00);
    switch(FVar2) {
    case invalidSignature:
      QMetaObject::tr((char *)local_60,(char *)&staticMetaObject,0x1b4e32);
      QMessageBox::setInformativeText(&local_48);
      break;
    case invalidRevision:
      QMetaObject::tr((char *)local_60,(char *)&staticMetaObject,0x1b4e56);
      QMessageBox::setInformativeText(&local_48);
      break;
    case cannotUpgrade:
      QMetaObject::tr((char *)local_60,(char *)&staticMetaObject,0x1b4e87);
      QMessageBox::setInformativeText(&local_48);
      break;
    case duplicateId:
    case invalid:
    case unknownChannel:
      QMetaObject::tr((char *)local_60,(char *)&staticMetaObject,0x1b4ea4);
      QMessageBox::setInformativeText(&local_48);
      break;
    default:
      QMetaObject::tr((char *)local_60,(char *)&staticMetaObject,0x1b4ebc);
      QMessageBox::setInformativeText(&local_48);
    }
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,8);
      }
    }
    QDialog::exec();
    ModuleFile::setName(this_00,&this->mUntitledString);
    QMessageBox::~QMessageBox((QMessageBox *)&local_48);
  }
  else {
    pushRecentFile(this,path);
  }
  updateWindowTitle(this);
  return;
}

Assistant:

void MainWindow::openFile(QString const& path) {
    mRenderer->forceStop();

    QApplication::setOverrideCursor(Qt::WaitCursor);
    bool opened = mModuleFile.open(path, *mModule);
    QApplication::restoreOverrideCursor();

    if (opened) {
        pushRecentFile(path);
    } else {
        QMessageBox msgbox;
        msgbox.setIcon(QMessageBox::Critical);
        msgbox.setText(tr("Could not open module"));

        auto error = mModuleFile.lastError();
        switch (error) {
            case trackerboy::FormatError::invalidSignature:
                msgbox.setInformativeText(tr("The file is not a trackerboy module"));
                break;
            case trackerboy::FormatError::invalidRevision:
                msgbox.setInformativeText(tr("The module is from a newer version of Trackerboy"));
                break;
            case trackerboy::FormatError::cannotUpgrade:
                msgbox.setInformativeText(tr("Failed to upgrade the module"));
                break;
            case trackerboy::FormatError::duplicateId:
            case trackerboy::FormatError::invalid:
            case trackerboy::FormatError::unknownChannel:
                msgbox.setInformativeText(tr("The module is corrupted"));
                break;
            default:
                msgbox.setInformativeText(tr("The file could not be read"));
                break;
        }


        msgbox.exec();
        mModuleFile.setName(mUntitledString);

    }

    // update window title with document name
    updateWindowTitle();
}